

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSat.c
# Opt level: O3

int Ssw_NodeIsConstrained(Ssw_Man_t *p,Aig_Obj_t *pPoObj)

{
  undefined4 uVar1;
  undefined4 in_EAX;
  int iVar2;
  int Lit;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pPoObj->pFanin0 & 0xfffffffffffffffe));
  iVar2 = Ssw_ObjSatNum((Ssw_Sat_t *)p->pMSat->vSatVars,
                        (Aig_Obj_t *)
                        (ulong)*(uint *)(((ulong)pPoObj->pFanin0 & 0xfffffffffffffffe) + 0x24));
  uVar1 = (undefined4)uStack_18;
  iVar2 = ((uint)pPoObj->pFanin0 & 1) + iVar2 * 2;
  uStack_18 = CONCAT44(iVar2,(undefined4)uStack_18) ^ 0x100000000;
  if ((p->pPars->fPolarFlip != 0) &&
     ((*(byte *)(((ulong)pPoObj->pFanin0 & 0xfffffffffffffffe) + 0x18) & 8) != 0)) {
    uStack_18 = CONCAT44(iVar2,uVar1);
  }
  iVar2 = sat_solver_addclause
                    (p->pMSat->pSat,(lit *)((long)&uStack_18 + 4),(lit *)&stack0xfffffffffffffff0);
  if (iVar2 != 0) {
    return 1;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSat.c"
                ,0x129,"int Ssw_NodeIsConstrained(Ssw_Man_t *, Aig_Obj_t *)");
}

Assistant:

int Ssw_NodeIsConstrained( Ssw_Man_t * p, Aig_Obj_t * pPoObj )
{
    int RetValue, Lit;
    Ssw_CnfNodeAddToSolver( p->pMSat, Aig_ObjFanin0(pPoObj) );
    // add constraint A = 1  ---->  A
    Lit = toLitCond( Ssw_ObjSatNum(p->pMSat,Aig_ObjFanin0(pPoObj)), !Aig_ObjFaninC0(pPoObj) );
    if ( p->pPars->fPolarFlip )
    {
        if ( Aig_ObjFanin0(pPoObj)->fPhase )  Lit = lit_neg( Lit );
    }
    RetValue = sat_solver_addclause( p->pMSat->pSat, &Lit, &Lit + 1 );
    assert( RetValue );
    return 1;
}